

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_OperatorSqBck_InsertMoved_ValueMoveCount_Test::
~DenseHashMapMoveTest_OperatorSqBck_InsertMoved_ValueMoveCount_Test
          (DenseHashMapMoveTest_OperatorSqBck_InsertMoved_ValueMoveCount_Test *this)

{
  void *in_RDI;
  
  ~DenseHashMapMoveTest_OperatorSqBck_InsertMoved_ValueMoveCount_Test
            ((DenseHashMapMoveTest_OperatorSqBck_InsertMoved_ValueMoveCount_Test *)0x1095c08);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, OperatorSqBck_InsertMoved_ValueMoveCount)
{
    dense_hash_map<int, A> h;
    h.set_empty_key(0);

    A::reset();
    h[1] = A(1);

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(1, A::move_ctor);
    ASSERT_EQ(1, A::move_assign);
}